

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined1 auVar11 [32];
  bool bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  char cVar37;
  AABBNodeMB4D *node1;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong *puVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar61 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  vint8 bi_1;
  vint8 bi;
  NodeRef stack [564];
  size_t local_11d8;
  ulong local_11d0 [564];
  
  puVar44 = local_11d0;
  local_11d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar53._4_4_ = fVar7;
  auVar53._0_4_ = fVar7;
  auVar53._8_4_ = fVar7;
  auVar53._12_4_ = fVar7;
  auVar53._16_4_ = fVar7;
  auVar53._20_4_ = fVar7;
  auVar53._24_4_ = fVar7;
  auVar53._28_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar55._4_4_ = fVar8;
  auVar55._0_4_ = fVar8;
  auVar55._8_4_ = fVar8;
  auVar55._12_4_ = fVar8;
  auVar55._16_4_ = fVar8;
  auVar55._20_4_ = fVar8;
  auVar55._24_4_ = fVar8;
  auVar55._28_4_ = fVar8;
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar56._4_4_ = fVar9;
  auVar56._0_4_ = fVar9;
  auVar56._8_4_ = fVar9;
  auVar56._12_4_ = fVar9;
  auVar56._16_4_ = fVar9;
  auVar56._20_4_ = fVar9;
  auVar56._24_4_ = fVar9;
  auVar56._28_4_ = fVar9;
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar57._4_4_ = iVar10;
  auVar57._0_4_ = iVar10;
  auVar57._8_4_ = iVar10;
  auVar57._12_4_ = iVar10;
  auVar57._16_4_ = iVar10;
  auVar57._20_4_ = iVar10;
  auVar57._24_4_ = iVar10;
  auVar57._28_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar60._4_4_ = iVar10;
  auVar60._0_4_ = iVar10;
  auVar60._8_4_ = iVar10;
  auVar60._12_4_ = iVar10;
  auVar60._16_4_ = iVar10;
  auVar60._20_4_ = iVar10;
  auVar60._24_4_ = iVar10;
  auVar60._28_4_ = iVar10;
  auVar61._0_4_ = fVar7 * -fVar1;
  auVar61._4_4_ = fVar7 * -fVar1;
  auVar61._8_4_ = fVar7 * -fVar1;
  auVar61._12_4_ = fVar7 * -fVar1;
  auVar61._16_4_ = fVar7 * -fVar1;
  auVar61._20_4_ = fVar7 * -fVar1;
  auVar61._28_36_ = in_ZMM10._28_36_;
  auVar61._24_4_ = fVar7 * -fVar1;
  auVar62._0_4_ = fVar8 * -fVar2;
  auVar62._4_4_ = fVar8 * -fVar2;
  auVar62._8_4_ = fVar8 * -fVar2;
  auVar62._12_4_ = fVar8 * -fVar2;
  auVar62._16_4_ = fVar8 * -fVar2;
  auVar62._20_4_ = fVar8 * -fVar2;
  auVar62._28_36_ = in_ZMM11._28_36_;
  auVar62._24_4_ = fVar8 * -fVar2;
  auVar64._0_4_ = fVar9 * -fVar3;
  auVar64._4_4_ = fVar9 * -fVar3;
  auVar64._8_4_ = fVar9 * -fVar3;
  auVar64._12_4_ = fVar9 * -fVar3;
  auVar64._16_4_ = fVar9 * -fVar3;
  auVar64._20_4_ = fVar9 * -fVar3;
  auVar64._28_36_ = in_ZMM12._28_36_;
  auVar64._24_4_ = fVar9 * -fVar3;
LAB_005eff08:
  do {
    bVar12 = puVar44 != &local_11d8;
    if (puVar44 == &local_11d8) {
      return bVar12;
    }
    uVar41 = puVar44[-1];
    puVar44 = puVar44 + -1;
    while ((uVar41 & 8) == 0) {
      fVar7 = *(float *)(ray + k * 4 + 0x70);
      uVar39 = (uint)uVar41 & 7;
      uVar38 = uVar41 & 0xfffffffffffffff0;
      if (uVar39 == 3) {
        auVar19 = *(undefined1 (*) [32])(uVar38 + 0x80);
        auVar20 = *(undefined1 (*) [32])(uVar38 + 0x100);
        auVar21 = *(undefined1 (*) [32])(uVar38 + 0x120);
        auVar11 = *(undefined1 (*) [32])(uVar38 + 0x140);
        fVar8 = 1.0 - fVar7;
        auVar65._4_4_ = fVar8;
        auVar65._0_4_ = fVar8;
        auVar65._8_4_ = fVar8;
        auVar65._12_4_ = fVar8;
        auVar65._16_4_ = fVar8;
        auVar65._20_4_ = fVar8;
        auVar65._24_4_ = fVar8;
        auVar65._28_4_ = fVar8;
        auVar51._0_4_ = fVar7 * *(float *)(uVar38 + 0x1c0);
        auVar51._4_4_ = fVar7 * *(float *)(uVar38 + 0x1c4);
        auVar51._8_4_ = fVar7 * *(float *)(uVar38 + 0x1c8);
        auVar51._12_4_ = fVar7 * *(float *)(uVar38 + 0x1cc);
        auVar51._16_4_ = fVar7 * *(float *)(uVar38 + 0x1d0);
        auVar51._20_4_ = fVar7 * *(float *)(uVar38 + 0x1d4);
        auVar51._24_4_ = fVar7 * *(float *)(uVar38 + 0x1d8);
        auVar51._28_4_ = 0;
        auVar13._4_4_ = fVar6 * auVar20._4_4_;
        auVar13._0_4_ = fVar6 * auVar20._0_4_;
        auVar13._8_4_ = fVar6 * auVar20._8_4_;
        auVar13._12_4_ = fVar6 * auVar20._12_4_;
        auVar13._16_4_ = fVar6 * auVar20._16_4_;
        auVar13._20_4_ = fVar6 * auVar20._20_4_;
        auVar13._24_4_ = fVar6 * auVar20._24_4_;
        auVar13._28_4_ = 0;
        auVar36._4_4_ = fVar6 * auVar21._4_4_;
        auVar36._0_4_ = fVar6 * auVar21._0_4_;
        auVar36._8_4_ = fVar6 * auVar21._8_4_;
        auVar36._12_4_ = fVar6 * auVar21._12_4_;
        auVar36._16_4_ = fVar6 * auVar21._16_4_;
        auVar36._20_4_ = fVar6 * auVar21._20_4_;
        auVar36._24_4_ = fVar6 * auVar21._24_4_;
        auVar36._28_4_ = in_ZMM11._28_4_;
        auVar34._4_4_ = uVar5;
        auVar34._0_4_ = uVar5;
        auVar34._8_4_ = uVar5;
        auVar34._12_4_ = uVar5;
        auVar34._16_4_ = uVar5;
        auVar34._20_4_ = uVar5;
        auVar34._24_4_ = uVar5;
        auVar34._28_4_ = uVar5;
        auVar48 = vfmadd231ps_fma(auVar13,auVar34,*(undefined1 (*) [32])(uVar38 + 0xa0));
        auVar50 = vfmadd231ps_fma(auVar36,auVar34,*(undefined1 (*) [32])(uVar38 + 0xc0));
        auVar35._4_4_ = fVar4;
        auVar35._0_4_ = fVar4;
        auVar35._8_4_ = fVar4;
        auVar35._12_4_ = fVar4;
        auVar35._16_4_ = fVar4;
        auVar35._20_4_ = fVar4;
        auVar35._24_4_ = fVar4;
        auVar35._28_4_ = fVar4;
        auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar35,*(undefined1 (*) [32])(uVar38 + 0x40));
        auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar35,*(undefined1 (*) [32])(uVar38 + 0x60));
        auVar63._8_4_ = 0x7fffffff;
        auVar63._0_8_ = 0x7fffffff7fffffff;
        auVar63._12_4_ = 0x7fffffff;
        auVar63._16_4_ = 0x7fffffff;
        auVar63._20_4_ = 0x7fffffff;
        auVar63._24_4_ = 0x7fffffff;
        auVar63._28_4_ = 0x7fffffff;
        auVar13 = vandps_avx(auVar63,ZEXT1632(auVar48));
        auVar58._8_4_ = 0x219392ef;
        auVar58._0_8_ = 0x219392ef219392ef;
        auVar58._12_4_ = 0x219392ef;
        auVar58._16_4_ = 0x219392ef;
        auVar58._20_4_ = 0x219392ef;
        auVar58._24_4_ = 0x219392ef;
        auVar58._28_4_ = 0x219392ef;
        auVar13 = vcmpps_avx(auVar13,auVar58,1);
        auVar14 = vblendvps_avx(ZEXT1632(auVar48),auVar58,auVar13);
        auVar13 = vandps_avx(ZEXT1632(auVar50),auVar63);
        auVar13 = vcmpps_avx(auVar13,auVar58,1);
        auVar15 = vblendvps_avx(ZEXT1632(auVar50),auVar58,auVar13);
        auVar16._4_4_ = fVar6 * auVar11._4_4_;
        auVar16._0_4_ = fVar6 * auVar11._0_4_;
        auVar16._8_4_ = fVar6 * auVar11._8_4_;
        auVar16._12_4_ = fVar6 * auVar11._12_4_;
        auVar16._16_4_ = fVar6 * auVar11._16_4_;
        auVar16._20_4_ = fVar6 * auVar11._20_4_;
        auVar16._24_4_ = fVar6 * auVar11._24_4_;
        auVar16._28_4_ = auVar13._28_4_;
        auVar48 = vfmadd231ps_fma(auVar16,auVar34,*(undefined1 (*) [32])(uVar38 + 0xe0));
        auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar35,auVar19);
        auVar13 = vandps_avx(auVar63,ZEXT1632(auVar48));
        auVar13 = vcmpps_avx(auVar13,auVar58,1);
        auVar13 = vblendvps_avx(ZEXT1632(auVar48),auVar58,auVar13);
        auVar17._4_4_ = fVar7 * *(float *)(uVar38 + 0x1e4);
        auVar17._0_4_ = fVar7 * *(float *)(uVar38 + 0x1e0);
        auVar17._8_4_ = fVar7 * *(float *)(uVar38 + 0x1e8);
        auVar17._12_4_ = fVar7 * *(float *)(uVar38 + 0x1ec);
        auVar17._16_4_ = fVar7 * *(float *)(uVar38 + 0x1f0);
        auVar17._20_4_ = fVar7 * *(float *)(uVar38 + 500);
        auVar17._24_4_ = fVar7 * *(float *)(uVar38 + 0x1f8);
        auVar17._28_4_ = fVar6;
        auVar25 = vfmadd231ps_fma(auVar51,auVar65,ZEXT832(0) << 0x20);
        auVar26 = vfmadd231ps_fma(auVar17,auVar65,ZEXT832(0) << 0x20);
        auVar29._4_4_ = fVar7 * *(float *)(uVar38 + 0x204);
        auVar29._0_4_ = fVar7 * *(float *)(uVar38 + 0x200);
        auVar29._8_4_ = fVar7 * *(float *)(uVar38 + 0x208);
        auVar29._12_4_ = fVar7 * *(float *)(uVar38 + 0x20c);
        auVar29._16_4_ = fVar7 * *(float *)(uVar38 + 0x210);
        auVar29._20_4_ = fVar7 * *(float *)(uVar38 + 0x214);
        auVar29._24_4_ = fVar7 * *(float *)(uVar38 + 0x218);
        auVar29._28_4_ = auVar19._28_4_;
        auVar27 = vfmadd231ps_fma(auVar29,auVar65,ZEXT832(0) << 0x20);
        auVar52._0_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x220);
        auVar52._4_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x224);
        auVar52._8_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x228);
        auVar52._12_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x22c);
        auVar52._16_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x230);
        auVar52._20_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x234);
        auVar52._24_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x238);
        auVar52._28_4_ = fVar8 + 0.0;
        auVar54._0_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x240);
        auVar54._4_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x244);
        auVar54._8_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x248);
        auVar54._12_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x24c);
        auVar54._16_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x250);
        auVar54._20_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x254);
        auVar54._24_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 600);
        auVar54._28_4_ = fVar8 + fVar4;
        auVar16 = vrcpps_avx(auVar14);
        auVar66._0_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x260);
        auVar66._4_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x264);
        auVar66._8_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x268);
        auVar66._12_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x26c);
        auVar66._16_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x270);
        auVar66._20_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x274);
        auVar66._24_4_ = fVar8 + fVar7 * *(float *)(uVar38 + 0x278);
        auVar66._28_4_ = fVar8 + 0.0;
        auVar17 = vrcpps_avx(auVar15);
        auVar59._8_4_ = 0x3f800000;
        auVar59._0_8_ = 0x3f8000003f800000;
        auVar59._12_4_ = 0x3f800000;
        auVar59._16_4_ = 0x3f800000;
        auVar59._20_4_ = 0x3f800000;
        auVar59._24_4_ = 0x3f800000;
        auVar59._28_4_ = 0x3f800000;
        auVar48 = vfnmadd213ps_fma(auVar14,auVar16,auVar59);
        auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar16,auVar16);
        auVar50 = vfnmadd213ps_fma(auVar15,auVar17,auVar59);
        auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar17,auVar17);
        auVar14 = vrcpps_avx(auVar13);
        auVar22 = vfnmadd213ps_fma(auVar13,auVar14,auVar59);
        auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar14,auVar14);
        auVar14._4_4_ = fVar3;
        auVar14._0_4_ = fVar3;
        auVar14._8_4_ = fVar3;
        auVar14._12_4_ = fVar3;
        auVar14._16_4_ = fVar3;
        auVar14._20_4_ = fVar3;
        auVar14._24_4_ = fVar3;
        auVar14._28_4_ = fVar3;
        auVar23 = vfmadd213ps_fma(auVar20,auVar14,*(undefined1 (*) [32])(uVar38 + 0x160));
        auVar20._4_4_ = fVar2;
        auVar20._0_4_ = fVar2;
        auVar20._8_4_ = fVar2;
        auVar20._12_4_ = fVar2;
        auVar20._16_4_ = fVar2;
        auVar20._20_4_ = fVar2;
        auVar20._24_4_ = fVar2;
        auVar20._28_4_ = fVar2;
        auVar28 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar20,*(undefined1 (*) [32])(uVar38 + 0xa0));
        auVar23 = vfmadd213ps_fma(auVar21,auVar14,*(undefined1 (*) [32])(uVar38 + 0x180));
        auVar24 = vfmadd213ps_fma(auVar11,auVar14,*(undefined1 (*) [32])(uVar38 + 0x1a0));
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar20,*(undefined1 (*) [32])(uVar38 + 0xc0));
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar20,*(undefined1 (*) [32])(uVar38 + 0xe0));
        auVar11._4_4_ = fVar1;
        auVar11._0_4_ = fVar1;
        auVar11._8_4_ = fVar1;
        auVar11._12_4_ = fVar1;
        auVar11._16_4_ = fVar1;
        auVar11._20_4_ = fVar1;
        auVar11._24_4_ = fVar1;
        auVar11._28_4_ = fVar1;
        auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar11,*(undefined1 (*) [32])(uVar38 + 0x40));
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar11,*(undefined1 (*) [32])(uVar38 + 0x60));
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar11,auVar19);
        auVar19 = vsubps_avx(ZEXT1632(auVar25),ZEXT1632(auVar28));
        auVar20 = vsubps_avx(auVar52,ZEXT1632(auVar28));
        auVar21 = vsubps_avx(ZEXT1632(auVar26),ZEXT1632(auVar23));
        auVar11 = vsubps_avx(auVar54,ZEXT1632(auVar23));
        auVar13 = vsubps_avx(ZEXT1632(auVar27),ZEXT1632(auVar24));
        auVar14 = vsubps_avx(auVar66,ZEXT1632(auVar24));
        auVar15._4_4_ = auVar48._4_4_ * auVar19._4_4_;
        auVar15._0_4_ = auVar48._0_4_ * auVar19._0_4_;
        auVar15._8_4_ = auVar48._8_4_ * auVar19._8_4_;
        auVar15._12_4_ = auVar48._12_4_ * auVar19._12_4_;
        auVar15._16_4_ = auVar19._16_4_ * 0.0;
        auVar15._20_4_ = auVar19._20_4_ * 0.0;
        auVar15._24_4_ = auVar19._24_4_ * 0.0;
        auVar15._28_4_ = auVar19._28_4_;
        auVar30._4_4_ = auVar48._4_4_ * auVar20._4_4_;
        auVar30._0_4_ = auVar48._0_4_ * auVar20._0_4_;
        auVar30._8_4_ = auVar48._8_4_ * auVar20._8_4_;
        auVar30._12_4_ = auVar48._12_4_ * auVar20._12_4_;
        auVar30._16_4_ = auVar20._16_4_ * 0.0;
        auVar30._20_4_ = auVar20._20_4_ * 0.0;
        auVar30._24_4_ = auVar20._24_4_ * 0.0;
        auVar30._28_4_ = auVar20._28_4_;
        auVar31._4_4_ = auVar50._4_4_ * auVar21._4_4_;
        auVar31._0_4_ = auVar50._0_4_ * auVar21._0_4_;
        auVar31._8_4_ = auVar50._8_4_ * auVar21._8_4_;
        auVar31._12_4_ = auVar50._12_4_ * auVar21._12_4_;
        auVar31._16_4_ = auVar21._16_4_ * 0.0;
        auVar31._20_4_ = auVar21._20_4_ * 0.0;
        auVar31._24_4_ = auVar21._24_4_ * 0.0;
        auVar31._28_4_ = auVar21._28_4_;
        auVar21._4_4_ = auVar22._4_4_ * auVar13._4_4_;
        auVar21._0_4_ = auVar22._0_4_ * auVar13._0_4_;
        auVar21._8_4_ = auVar22._8_4_ * auVar13._8_4_;
        auVar21._12_4_ = auVar22._12_4_ * auVar13._12_4_;
        auVar21._16_4_ = auVar13._16_4_ * 0.0;
        auVar21._20_4_ = auVar13._20_4_ * 0.0;
        auVar21._24_4_ = auVar13._24_4_ * 0.0;
        auVar21._28_4_ = auVar13._28_4_;
        auVar32._4_4_ = auVar50._4_4_ * auVar11._4_4_;
        auVar32._0_4_ = auVar50._0_4_ * auVar11._0_4_;
        auVar32._8_4_ = auVar50._8_4_ * auVar11._8_4_;
        auVar32._12_4_ = auVar50._12_4_ * auVar11._12_4_;
        auVar32._16_4_ = auVar11._16_4_ * 0.0;
        auVar32._20_4_ = auVar11._20_4_ * 0.0;
        auVar32._24_4_ = auVar11._24_4_ * 0.0;
        auVar32._28_4_ = auVar11._28_4_;
        auVar33._4_4_ = auVar22._4_4_ * auVar14._4_4_;
        auVar33._0_4_ = auVar22._0_4_ * auVar14._0_4_;
        auVar33._8_4_ = auVar22._8_4_ * auVar14._8_4_;
        auVar33._12_4_ = auVar22._12_4_ * auVar14._12_4_;
        auVar33._16_4_ = auVar14._16_4_ * 0.0;
        auVar33._20_4_ = auVar14._20_4_ * 0.0;
        auVar33._24_4_ = auVar14._24_4_ * 0.0;
        auVar33._28_4_ = auVar14._28_4_;
        auVar19 = vpminsd_avx2(auVar31,auVar32);
        auVar20 = vpminsd_avx2(auVar21,auVar33);
        auVar19 = vmaxps_avx(auVar19,auVar20);
        auVar13 = vpminsd_avx2(auVar15,auVar30);
        auVar11 = vpmaxsd_avx2(auVar15,auVar30);
        auVar20 = vpmaxsd_avx2(auVar31,auVar32);
        auVar21 = vpmaxsd_avx2(auVar21,auVar33);
        auVar21 = vminps_avx(auVar20,auVar21);
        auVar20 = vmaxps_avx(auVar57,auVar13);
        auVar19 = vmaxps_avx(auVar20,auVar19);
        auVar20 = vminps_avx(auVar60,auVar11);
        auVar20 = vminps_avx(auVar20,auVar21);
        auVar19 = vcmpps_avx(auVar19,auVar20,2);
        auVar48 = auVar19._0_16_;
        auVar50 = auVar19._16_16_;
LAB_005f0352:
        auVar48 = vpackssdw_avx(auVar48,auVar50);
      }
      else {
        auVar49._4_4_ = fVar7;
        auVar49._0_4_ = fVar7;
        auVar49._8_4_ = fVar7;
        auVar49._12_4_ = fVar7;
        auVar49._16_4_ = fVar7;
        auVar49._20_4_ = fVar7;
        auVar49._24_4_ = fVar7;
        auVar49._28_4_ = fVar7;
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100 + uVar45),auVar49,
                                  *(undefined1 (*) [32])(uVar38 + 0x40 + uVar45));
        auVar48 = vfmadd213ps_fma(ZEXT1632(auVar48),auVar53,auVar61._0_32_);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100 + uVar43),auVar49,
                                  *(undefined1 (*) [32])(uVar38 + 0x40 + uVar43));
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar55,auVar62._0_32_);
        auVar19 = vpmaxsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar50));
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100 + uVar46),auVar49,
                                  *(undefined1 (*) [32])(uVar38 + 0x40 + uVar46));
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100 + (uVar45 ^ 0x20)),auVar49,
                                  *(undefined1 (*) [32])(uVar38 + 0x40 + (uVar45 ^ 0x20)));
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar53,auVar61._0_32_);
        auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100 + (uVar43 ^ 0x20)),auVar49,
                                  *(undefined1 (*) [32])(uVar38 + 0x40 + (uVar43 ^ 0x20)));
        auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar55,auVar62._0_32_);
        auVar21 = vpminsd_avx2(ZEXT1632(auVar50),ZEXT1632(auVar22));
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100 + (uVar46 ^ 0x20)),auVar49,
                                  *(undefined1 (*) [32])(uVar38 + 0x40 + (uVar46 ^ 0x20)));
        auVar48 = vfmadd213ps_fma(ZEXT1632(auVar48),auVar56,auVar64._0_32_);
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar56,auVar64._0_32_);
        auVar20 = vpmaxsd_avx2(ZEXT1632(auVar48),auVar57);
        auVar19 = vpmaxsd_avx2(auVar19,auVar20);
        auVar20 = vpminsd_avx2(ZEXT1632(auVar50),auVar60);
        auVar20 = vpminsd_avx2(auVar21,auVar20);
        auVar19 = vcmpps_avx(auVar19,auVar20,2);
        if (uVar39 == 6) {
          auVar20 = vcmpps_avx(*(undefined1 (*) [32])(uVar38 + 0x1c0),auVar49,2);
          auVar21 = vcmpps_avx(auVar49,*(undefined1 (*) [32])(uVar38 + 0x1e0),1);
          auVar20 = vandps_avx(auVar20,auVar21);
          auVar19 = vandps_avx(auVar20,auVar19);
          auVar48 = auVar19._0_16_;
          auVar50 = auVar19._16_16_;
          goto LAB_005f0352;
        }
        auVar48 = vpackssdw_avx(auVar19._0_16_,auVar19._16_16_);
      }
      auVar48 = vpsllw_avx(auVar48,0xf);
      if ((((((((auVar48 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar48 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar48 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar48 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar48[0xf])
      goto LAB_005eff08;
      auVar48 = vpacksswb_avx(auVar48,auVar48);
      bVar18 = SUB161(auVar48 >> 7,0) & 1 | (SUB161(auVar48 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar48 >> 0x17,0) & 1) << 2 | (SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar48 >> 0x27,0) & 1) << 4 | (SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar48 >> 0x37,0) & 1) << 6 | SUB161(auVar48 >> 0x3f,0) << 7;
      lVar42 = 0;
      for (uVar41 = (ulong)bVar18; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
        lVar42 = lVar42 + 1;
      }
      uVar41 = *(ulong *)(uVar38 + lVar42 * 8);
      uVar39 = bVar18 - 1 & (uint)bVar18;
      uVar40 = (ulong)uVar39;
      if (uVar39 != 0) {
        *puVar44 = uVar41;
        lVar42 = 0;
        for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
          lVar42 = lVar42 + 1;
        }
        uVar39 = uVar39 - 1 & uVar39;
        uVar40 = (ulong)uVar39;
        bVar47 = uVar39 == 0;
        while( true ) {
          puVar44 = puVar44 + 1;
          uVar41 = *(ulong *)(uVar38 + lVar42 * 8);
          if (bVar47) break;
          *puVar44 = uVar41;
          lVar42 = 0;
          for (uVar41 = uVar40; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
            lVar42 = lVar42 + 1;
          }
          uVar40 = uVar40 - 1 & uVar40;
          bVar47 = uVar40 == 0;
        }
      }
    }
    cVar37 = (**(code **)((long)This->leafIntersector +
                         (ulong)*(byte *)(uVar41 & 0xfffffffffffffff0) * 0x40 + 0x18))
                       (pre,ray,k,context);
    if (cVar37 != '\0') {
      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
      return bVar12;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }